

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O2

t_value<xemmai::t_pointer> __thiscall
xemmai::t_value<xemmai::t_pointer>::f_invoke<>
          (t_value<xemmai::t_pointer> *this,t_object *a_key,size_t *a_index)

{
  t_pvalue *a_stack;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar1;
  long *plVar2;
  size_t *in_RCX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  t_value<xemmai::t_pointer> tVar3;
  
  plVar2 = (long *)__tls_get_addr(&PTR_00126ee8);
  a_stack = (t_pvalue *)*plVar2;
  *plVar2 = (long)(a_stack + 2);
  a_stack[1].super_t_pointer.v_p = (t_object *)0x0;
  f_call((t_value<xemmai::t_pointer> *)a_key,(t_object *)a_index,in_RCX,a_stack,0);
  aVar1 = a_stack->field_0;
  (this->super_t_pointer).v_p = (a_stack->super_t_pointer).v_p;
  this->field_0 = aVar1;
  *plVar2 = (long)a_stack;
  tVar3.field_0.v_integer = extraout_RDX.v_integer;
  tVar3.super_t_pointer.v_p = (t_object *)this;
  return tVar3;
}

Assistant:

inline t_pvalue t_value<T_tag>::f_invoke(t_object* a_key, size_t& a_index, auto&&... a_arguments) const
{
	t_scoped_stack stack(sizeof...(a_arguments) + 2, std::forward<decltype(a_arguments)>(a_arguments)...);
	stack[1] = nullptr;
	f_call(a_key, a_index, stack, sizeof...(a_arguments));
	return stack[0];
}